

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrespondent.c
# Opt level: O1

int nn_xrespondent_recv(nn_sockbase *self,nn_msg *msg)

{
  uint uVar1;
  int iVar2;
  uint32_t uVar3;
  void *pvVar4;
  size_t sVar5;
  ulong uVar6;
  int maxttl;
  size_t sz;
  nn_pipe *pipe;
  nn_chunkref ref;
  int local_5c;
  size_t local_58;
  nn_pipe *local_50 [5];
  
  uVar1 = nn_fq_recv((nn_fq *)&self[2].sock,msg,local_50);
  if (-1 < (int)uVar1) {
    if ((uVar1 & 2) == 0) {
      local_58 = 4;
      iVar2 = nn_sockbase_getopt(self,0x11,&local_5c,&local_58);
      if (iVar2 != 0) {
        nn_xrespondent_recv_cold_1();
LAB_001289d1:
        nn_xrespondent_recv_cold_2();
      }
      pvVar4 = nn_chunkref_data(&msg->body);
      local_58 = nn_chunkref_size(&msg->body);
      iVar2 = -1;
      uVar6 = 0;
      do {
        if (local_58 < uVar6 + 4) goto LAB_0012897c;
        uVar3 = nn_getl((uint8_t *)(uVar6 + (long)pvVar4));
        iVar2 = iVar2 + 1;
        uVar6 = uVar6 + 4;
      } while (-1 < (int)uVar3);
      if (local_5c <= iVar2) {
LAB_0012897c:
        nn_msg_term(msg);
        return -0xb;
      }
      sVar5 = nn_chunkref_size(&msg->sphdr);
      if (sVar5 != 0) goto LAB_001289d1;
      nn_xrespondent_recv_cold_3();
    }
    nn_xrespondent_recv_cold_4();
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

int nn_xrespondent_recv (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_xrespondent *xrespondent;
    struct nn_pipe *pipe;
    int i;
    size_t sz;
    void *data;
    struct nn_chunkref ref;
    struct nn_xrespondent_data *pipedata;
    int maxttl;

    xrespondent = nn_cont (self, struct nn_xrespondent, sockbase);

    rc = nn_fq_recv (&xrespondent->inpipes, msg, &pipe);
    if (nn_slow (rc < 0))
        return rc;

    /*  Split the header (including survey ID) from the body, if needed. */
    if (!(rc & NN_PIPE_PARSED)) {

        sz = sizeof (maxttl);
        rc = nn_sockbase_getopt (self, NN_MAXTTL, &maxttl, &sz);
        errnum_assert (rc == 0, -rc);

        /*  Determine the size of the message header. */
        data = nn_chunkref_data (&msg->body);
        sz = nn_chunkref_size (&msg->body);
        i = 0;

        while (1) {
	    /*  Ignore the malformed surveys without the bottom of the stack. */
	    if (nn_slow ((i + 1) * sizeof (uint32_t) > sz)) {
                nn_msg_term (msg);
                return -EAGAIN;
            }

            /*  If the bottom of the backtrace stack is reached, proceed. */
            if (nn_getl ((uint8_t*)(((uint32_t*) data) + i)) & 0x80000000)
                break;

            ++i;
        }
        ++i;
    
        /*  Ignore messages with too many hops. */
        if (i > maxttl) {
            nn_msg_term (msg);
            return -EAGAIN;
        }

        nn_assert (nn_chunkref_size (&msg->sphdr) == 0);
        nn_chunkref_term (&msg->sphdr);
        nn_chunkref_init (&msg->sphdr, i * sizeof (uint32_t));
        memcpy (nn_chunkref_data (&msg->sphdr), data, i * sizeof (uint32_t));
        nn_chunkref_trim (&msg->body, i * sizeof (uint32_t));
    }

    /*  Prepend the header by the pipe key. */
    pipedata = nn_pipe_getdata (pipe);
    nn_chunkref_init (&ref, nn_chunkref_size (&msg->sphdr) + sizeof (uint32_t));
    nn_putl (nn_chunkref_data (&ref), pipedata->outitem.key);
    memcpy (((uint8_t *) nn_chunkref_data (&ref)) + sizeof (uint32_t),
        nn_chunkref_data (&msg->sphdr), nn_chunkref_size (&msg->sphdr));
    nn_chunkref_term (&msg->sphdr);
    nn_chunkref_mv (&msg->sphdr, &ref);

    return 0;
}